

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O1

wchar_t archive_read_disk_set_atime_restored(archive *_a)

{
  byte *pbVar1;
  int iVar2;
  wchar_t wVar3;
  
  iVar2 = __archive_check_magic(_a,0xbadb0c5,0x7fff,"archive_read_disk_restore_atime");
  wVar3 = L'\xffffffe2';
  if (iVar2 != -0x1e) {
    *(byte *)&_a[1].file_count = (byte)_a[1].file_count | 1;
    wVar3 = L'\0';
    if (*(long *)&_a[1].archive_format != 0) {
      pbVar1 = (byte *)(*(long *)&_a[1].archive_format + 0x20);
      *pbVar1 = *pbVar1 | 0x80;
      wVar3 = L'\0';
    }
  }
  return wVar3;
}

Assistant:

int
archive_read_disk_set_atime_restored(struct archive *_a)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
	    ARCHIVE_STATE_ANY, "archive_read_disk_restore_atime");
#ifdef HAVE_UTIMES
	a->flags |= ARCHIVE_READDISK_RESTORE_ATIME;
	if (a->tree != NULL)
		a->tree->flags |= needsRestoreTimes;
	return (ARCHIVE_OK);
#else
	/* Display warning and unset flag */
	archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
	    "Cannot restore access time on this system");
	a->flags &= ~ARCHIVE_READDISK_RESTORE_ATIME;
	return (ARCHIVE_WARN);
#endif
}